

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

Record * env_match(char *identifer,Environment *env)

{
  Record *pRVar1;
  int iVar2;
  Environment *pEVar3;
  
  do {
    pEVar3 = env;
    if (env == (Environment *)0x0) {
      return (Record *)0x0;
    }
    while (pRVar1 = pEVar3->front, pRVar1 != (Record *)0x0) {
      iVar2 = strcmp(pRVar1->name,identifer);
      if (iVar2 == 0) {
        return pRVar1;
      }
      pEVar3 = (Environment *)&pRVar1->next;
    }
    env = env->parent;
  } while( true );
}

Assistant:

static Record* env_match(char* identifer, Environment *env){
    if(env == NULL)
        return NULL;
    Record *bak = env->front;
    while(bak != NULL){
        if(strcmp(bak->name, identifer) == 0)
            return bak;
        bak = bak->next;
    }
    return env_match(identifer, env->parent);
}